

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::StackScriptFunction::BoxState::BoxNativeFrame
          (BoxState *this,JavascriptStackWalker *walker,FunctionBody *callerFunctionBody)

{
  bool bVar1;
  ScriptContext *pSVar2;
  ThreadContext *pTVar3;
  Var *local_48;
  Var *boxedScopeSlots;
  Var *stackScopeSlots;
  FrameDisplay *boxedFrameDisplay;
  FrameDisplay *stackFrameDisplay;
  FunctionBody *local_20;
  FunctionBody *callerFunctionBody_local;
  JavascriptStackWalker *walker_local;
  BoxState *this_local;
  
  stackFrameDisplay = (FrameDisplay *)this;
  local_20 = callerFunctionBody;
  callerFunctionBody_local = (FunctionBody *)walker;
  walker_local = (JavascriptStackWalker *)this;
  ForEachStackNestedFunctionNative<Js::StackScriptFunction::BoxState::BoxNativeFrame(Js::JavascriptStackWalker_const&,Js::FunctionBody*)::__0>
            (this,walker,callerFunctionBody,(anon_class_8_1_8991fb9c)this);
  boxedFrameDisplay =
       GetFrameDisplayFromNativeFrame
                 (this,(JavascriptStackWalker *)callerFunctionBody_local,local_20);
  bVar1 = ThreadContext::IsOnStack(boxedFrameDisplay);
  if (bVar1) {
    stackScopeSlots = (Var *)0x0;
    bVar1 = JsUtil::
            BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<Js::FrameDisplay*>
                      ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->boxedValues,&boxedFrameDisplay,&stackScopeSlots);
    if (bVar1) {
      SetFrameDisplayFromNativeFrame
                (this,(JavascriptStackWalker *)callerFunctionBody_local,local_20,
                 (FrameDisplay *)stackScopeSlots);
      pSVar2 = FunctionProxy::GetScriptContext((FunctionProxy *)local_20);
      pTVar3 = ScriptContext::GetThreadContext(pSVar2);
      ThreadContext::AddImplicitCallFlags(pTVar3,ImplicitCall_Accessor);
    }
  }
  boxedScopeSlots =
       GetScopeSlotsFromNativeFrame(this,(JavascriptStackWalker *)callerFunctionBody_local,local_20)
  ;
  bVar1 = ThreadContext::IsOnStack(boxedScopeSlots);
  if (bVar1) {
    local_48 = (Var *)0x0;
    bVar1 = JsUtil::
            BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void**>
                      ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->boxedValues,&boxedScopeSlots,&local_48);
    if (bVar1) {
      SetScopeSlotsFromNativeFrame
                (this,(JavascriptStackWalker *)callerFunctionBody_local,local_20,local_48);
      pSVar2 = FunctionProxy::GetScriptContext((FunctionProxy *)local_20);
      pTVar3 = ScriptContext::GetThreadContext(pSVar2);
      ThreadContext::AddImplicitCallFlags(pTVar3,ImplicitCall_Accessor);
    }
  }
  return;
}

Assistant:

void StackScriptFunction::BoxState::BoxNativeFrame(JavascriptStackWalker const& walker, FunctionBody * callerFunctionBody)
    {
        this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *curr)
        {
            StackScriptFunction * func = VarTo<StackScriptFunction>(curr);
            // Need to check if we need the script function as the list of script function
            // include inlinee stack function that doesn't necessary need to be boxed
            if (this->NeedBoxScriptFunction(func))
            {
                // Box the stack function, even if they might not be "created" in the byte code yet.
                // Some of them will not be captured in slots, so we just need to box them and record it with the
                // stack func so that when we can just use the boxed value when we need it.
                this->BoxStackFunction(func);
            }
        });

        // Write back the boxed stack closure pointers at the designated stack locations.
        Js::FrameDisplay *stackFrameDisplay = this->GetFrameDisplayFromNativeFrame(walker, callerFunctionBody);
        if (ThreadContext::IsOnStack(stackFrameDisplay))
        {
            Js::FrameDisplay *boxedFrameDisplay = nullptr;
            if (boxedValues.TryGetValue(stackFrameDisplay, (void**)&boxedFrameDisplay))
            {
                this->SetFrameDisplayFromNativeFrame(walker, callerFunctionBody, boxedFrameDisplay);
                callerFunctionBody->GetScriptContext()->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);
            }
        }

        Var              *stackScopeSlots = this->GetScopeSlotsFromNativeFrame(walker, callerFunctionBody);
        if (ThreadContext::IsOnStack(stackScopeSlots))
        {
            Var              *boxedScopeSlots = nullptr;
            if (boxedValues.TryGetValue(stackScopeSlots, (void**)&boxedScopeSlots))
            {
                this->SetScopeSlotsFromNativeFrame(walker, callerFunctionBody, boxedScopeSlots);
                callerFunctionBody->GetScriptContext()->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);
            }
        }
    }